

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_hashmap *
jx9NewHashmap(jx9_vm *pVm,_func_sxu32_sxi64 *xIntHash,_func_sxu32_void_ptr_sxu32 *xBlobHash)

{
  _func_sxu32_void_ptr_sxu32 *local_40;
  SyMutex *local_38;
  jx9_hashmap *pMap;
  _func_sxu32_void_ptr_sxu32 *xBlobHash_local;
  _func_sxu32_sxi64 *xIntHash_local;
  jx9_vm *pVm_local;
  
  pVm_local = (jx9_vm *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x58);
  if (pVm_local == (jx9_vm *)0x0) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    SyZero(pVm_local,0x58);
    (pVm_local->sAllocator).pMutexMethods = (SyMutexMethods *)pVm;
    *(undefined4 *)((pVm_local->sAllocator).apPool + 2) = 1;
    local_38 = (SyMutex *)xIntHash;
    if (xIntHash == (_func_sxu32_sxi64 *)0x0) {
      local_38 = (SyMutex *)IntHash;
    }
    (pVm_local->sAllocator).pMutex = local_38;
    local_40 = xBlobHash;
    if (xBlobHash == (_func_sxu32_void_ptr_sxu32 *)0x0) {
      local_40 = BinHash;
    }
    *(_func_sxu32_void_ptr_sxu32 **)&(pVm_local->sAllocator).nMagic = local_40;
  }
  return (jx9_hashmap *)pVm_local;
}

Assistant:

JX9_PRIVATE jx9_hashmap * jx9NewHashmap(
	jx9_vm *pVm,              /* VM that trigger the hashmap creation */
	sxu32 (*xIntHash)(sxi64), /* Hash function for int keys.NULL otherwise*/
	sxu32 (*xBlobHash)(const void *, sxu32) /* Hash function for BLOB keys.NULL otherwise */
	)
{
	jx9_hashmap *pMap;
	/* Allocate a new instance */
	pMap = (jx9_hashmap *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_hashmap));
	if( pMap == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pMap, sizeof(jx9_hashmap));
	/* Fill in the structure */
	pMap->pVm = &(*pVm);
	pMap->iRef = 1;
	/* pMap->iFlags = 0; */
	/* Default hash functions */
	pMap->xIntHash  = xIntHash ? xIntHash : IntHash;
	pMap->xBlobHash = xBlobHash ? xBlobHash : BinHash;
	return pMap;
}